

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O1

err_t bashHash(octet *hash,size_t l,void *src,size_t count)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t buf;
  err_t eVar3;
  bash_hash_st *st;
  ulong count_00;
  
  eVar3 = 0x1f6;
  if ((l != 0) && (l < 0x101 && (l & 0xf) == 0)) {
    bVar1 = memIsValid(src,count);
    eVar3 = 0x6d;
    if (bVar1 != 0) {
      count_00 = l >> 2;
      bVar1 = memIsValid(hash,count_00);
      if (bVar1 != 0) {
        eVar3 = 0;
        sVar2 = bashF_deep();
        buf = blobCreate(sVar2 + 400);
        if (buf == (blob_t)0x0) {
          eVar3 = 0x6e;
        }
        else {
          memSet(buf,'\0',0xc0);
          *(char *)((long)buf + 0xb8) = (char)count_00;
          *(size_t *)((long)buf + 0x180) = 0xc0 - (l >> 1);
          *(undefined8 *)((long)buf + 0x188) = 0;
          bashHashStepH(src,count,buf);
          bashHashStepG_internal((size_t)buf,(void *)count);
          memMove(hash,(void *)((long)buf + 0xc0),count_00);
          blobClose(buf);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bashHash(octet hash[], size_t l, const void* src, size_t count)
{
	void* state;
	// проверить входные данные
	if (l == 0 || l % 16 != 0 || l > 256)
		return ERR_BAD_PARAMS;
	if (!memIsValid(src, count) || !memIsValid(hash, l / 4))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bashHash_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// вычислить хэш-значение
	bashHashStart(state, l);
	bashHashStepH(src, count, state);
	bashHashStepG(hash, l / 4, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}